

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

Time __thiscall helics::TimeCoordinator::getTimeProperty(TimeCoordinator *this,int timeProperty)

{
  undefined4 in_ESI;
  long in_RDI;
  baseType local_8;
  
  switch(in_ESI) {
  case 0x89:
    local_8 = *(baseType *)(in_RDI + 0x228);
    break;
  default:
    local_8 = (baseType)TimeRepresentation<count_time<9,_long>_>::minVal();
    break;
  case 0x8c:
    local_8 = *(baseType *)(in_RDI + 0x248);
    break;
  case 0x8d:
    local_8 = *(baseType *)(in_RDI + 0x240);
    break;
  case 0x94:
    local_8 = *(baseType *)(in_RDI + 0x230);
    break;
  case 0x96:
    local_8 = *(baseType *)(in_RDI + 0x238);
  }
  return (Time)local_8;
}

Assistant:

Time TimeCoordinator::getTimeProperty(int timeProperty) const
{
    switch (timeProperty) {
        case defs::Properties::OUTPUT_DELAY:
            return info.outputDelay;
        case defs::Properties::INPUT_DELAY:
            return info.inputDelay;
        case defs::Properties::TIME_DELTA:
            return info.timeDelta;
        case defs::Properties::PERIOD:
            return info.period;
        case defs::Properties::OFFSET:
            return info.offset;
        default:
            return Time::minVal();
    }
}